

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test3::prepareUniformBuffer
          (GPUShaderFP64Test3 *this,programInfo *program_info,bool verify_offsets)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  GLuint *pGVar9;
  pointer puVar10;
  TestContext *pTVar11;
  TestLog *pTVar12;
  MessageBuilder *pMVar13;
  reference pvVar14;
  MessageBuilder local_3b8;
  MessageBuilder local_238;
  GLuint local_b4;
  GLdouble *pGStack_b0;
  GLint expected_offset;
  GLdouble *value_dst;
  GLdouble GStack_a0;
  GLuint value_offset;
  GLdouble value;
  GLuint column_elem;
  GLuint column;
  GLuint element;
  GLint uniform_offset;
  GLuint column_length;
  GLuint n_elements;
  GLuint n_columns;
  GLint matrix_stride;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_data;
  const_iterator it_uniform_matrix_strides;
  const_iterator it_uniform_offsets;
  const_iterator it_uniform_details;
  GLuint type_ordinal;
  bool offset_verification_result;
  Functions *gl;
  GLuint buffer_size;
  bool verify_offsets_local;
  programInfo *program_info_local;
  GPUShaderFP64Test3 *this_local;
  long lVar8;
  
  uVar1 = program_info->m_buffer_size;
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  bVar3 = true;
  it_uniform_details._M_current._0_4_ = 1;
  it_uniform_offsets._M_current =
       (int *)std::
              vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
              ::begin(&this->m_uniform_details);
  it_uniform_matrix_strides =
       std::vector<int,_std::allocator<int>_>::begin(&program_info->m_uniform_offsets);
  buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::begin
                          (&program_info->m_uniform_matrix_strides);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,(ulong)uVar1);
  while( true ) {
    _n_columns = std::
                 vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
                 ::end(&this->m_uniform_details);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                        *)&n_columns,
                       (__normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                        *)&it_uniform_offsets);
    if (!bVar4) break;
    pGVar9 = (GLuint *)
             __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &buffer_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    n_elements = *pGVar9;
    puVar10 = __gnu_cxx::
              __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
              ::operator->((__normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                            *)&it_uniform_offsets);
    column_length = puVar10->m_n_columns;
    puVar10 = __gnu_cxx::
              __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
              ::operator->((__normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                            *)&it_uniform_offsets);
    uniform_offset = puVar10->m_n_elements;
    element = (uint)uniform_offset / column_length;
    pGVar9 = (GLuint *)
             __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&it_uniform_matrix_strides);
    column = *pGVar9;
    for (column_elem = 0; column_elem < (uint)uniform_offset; column_elem = column_elem + 1) {
      value._4_4_ = column_elem / element;
      value._0_4_ = column_elem % element;
      GStack_a0 = getExpectedValue(this,(GLuint)it_uniform_details._M_current,column_elem);
      value_dst._4_4_ = column + value._4_4_ * n_elements + value._0_4_ * 8;
      pGStack_b0 = (GLdouble *)
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                              (ulong)value_dst._4_4_);
      *pGStack_b0 = GStack_a0;
    }
    if (verify_offsets) {
      puVar10 = __gnu_cxx::
                __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                ::operator->((__normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                              *)&it_uniform_offsets);
      local_b4 = puVar10->m_expected_std140_offset;
      if (local_b4 != column) {
        if (bVar3 == true) {
          pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar12 = tcu::TestContext::getLog(pTVar11);
          tcu::TestLog::operator<<(&local_238,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar13 = tcu::MessageBuilder::operator<<(&local_238,(char (*) [6])0x2c668b3);
          tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_238);
        }
        pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar12 = tcu::TestContext::getLog(pTVar11);
        tcu::TestLog::operator<<(&local_3b8,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar13 = tcu::MessageBuilder::operator<<(&local_3b8,(char (*) [10])"Uniform: ");
        puVar10 = __gnu_cxx::
                  __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                  ::operator->((__normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                                *)&it_uniform_offsets);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&puVar10->m_name);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [14])" has offset: ");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(int *)&column);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [20])". Expected offset: ");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(int *)&local_b4);
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3b8);
        bVar3 = false;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
    ::operator++((__normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                  *)&it_uniform_offsets);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&it_uniform_matrix_strides);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    it_uniform_details._M_current._0_4_ = (GLuint)it_uniform_details._M_current + 1;
  }
  (**(code **)(lVar8 + 0x40))(0x8a11,this->m_uniform_buffer_id);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1472);
  pcVar2 = *(code **)(lVar8 + 0x150);
  pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  (*pcVar2)(0x8a11,uVar1,pvVar14,0x88e4);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1475);
  (**(code **)(lVar8 + 0x50))(0x8a11,0,this->m_uniform_buffer_id,0,uVar1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1479);
  (**(code **)(lVar8 + 0x15d0))
            (program_info->m_program_object_id,program_info->m_uniform_block_index,0);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"UniformBlockBinding",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x147c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  return bVar3;
}

Assistant:

bool GPUShaderFP64Test3::prepareUniformBuffer(const programInfo& program_info, bool verify_offsets) const
{
	const glw::GLuint							buffer_size = program_info.m_buffer_size;
	const glw::Functions&						gl			= m_context.getRenderContext().getFunctions();
	bool										offset_verification_result = true;
	glw::GLuint									type_ordinal			   = 1;
	std::vector<uniformDetails>::const_iterator it_uniform_details		   = m_uniform_details.begin();
	std::vector<glw::GLint>::const_iterator		it_uniform_offsets		   = program_info.m_uniform_offsets.begin();
	std::vector<glw::GLint>::const_iterator it_uniform_matrix_strides = program_info.m_uniform_matrix_strides.begin();

	/* Prepare storage for uniform buffer data */
	std::vector<glw::GLubyte> buffer_data;
	buffer_data.resize(buffer_size);

	/* For each "double precision" uniform */
	for (/* start conditions already set up */; m_uniform_details.end() != it_uniform_details;
		 ++it_uniform_details, ++it_uniform_offsets, ++it_uniform_matrix_strides, ++type_ordinal)
	{
		const glw::GLint  matrix_stride  = *it_uniform_matrix_strides;
		const glw::GLuint n_columns		 = it_uniform_details->m_n_columns;
		const glw::GLuint n_elements	 = it_uniform_details->m_n_elements;
		const glw::GLuint column_length  = n_elements / n_columns;
		const glw::GLint  uniform_offset = *it_uniform_offsets;

		/* For each element of uniform */
		for (glw::GLuint element = 0; element < n_elements; ++element)
		{
			const glw::GLuint   column		= element / column_length;
			const glw::GLuint   column_elem = element % column_length;
			const glw::GLdouble value		= getExpectedValue(type_ordinal, element);
			const glw::GLuint   value_offset =
				static_cast<glw::GLuint>(uniform_offset + column * matrix_stride + column_elem * sizeof(glw::GLdouble));

			glw::GLdouble* value_dst = (glw::GLdouble*)&buffer_data[value_offset];

			/* Store value */
			*value_dst = value;
		}

		/* Uniform offset verification */
		if (true == verify_offsets)
		{
			const glw::GLint expected_offset = it_uniform_details->m_expected_std140_offset;

			if (expected_offset != uniform_offset)
			{
				if (true == offset_verification_result)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error" << tcu::TestLog::EndMessage;
				}

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Uniform: " << it_uniform_details->m_name
					<< " has offset: " << uniform_offset << ". Expected offset: " << expected_offset
					<< tcu::TestLog::EndMessage;

				offset_verification_result = false;
			}
		}
	}

	/* Update uniform buffer with prepared data */
	gl.bindBuffer(GL_UNIFORM_BUFFER, m_uniform_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	gl.bufferData(GL_UNIFORM_BUFFER, buffer_size, &buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

	/* Bind uniform buffer as data source for named uniform block */
	gl.bindBufferRange(GL_UNIFORM_BUFFER, 0 /* index */, m_uniform_buffer_id, 0, buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

	gl.uniformBlockBinding(program_info.m_program_object_id, program_info.m_uniform_block_index, 0 /* binding */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformBlockBinding");

	/* Done */
	return offset_verification_result;
}